

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

bool __thiscall QRegion::intersects(QRegion *this,QRegion *region)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  const_iterator r1;
  const_iterator pQVar4;
  const_iterator r2;
  const_iterator pQVar5;
  QRegion *__range2;
  QRect *otherRect;
  QRect *myRect;
  QRect QVar6;
  QRect QVar7;
  
  if ((((this->d != &shared_empty) && (iVar1 = this->d->qt_rgn->numRects, iVar1 != 0)) &&
      (region->d != &shared_empty)) && (iVar2 = region->d->qt_rgn->numRects, iVar2 != 0)) {
    QVar6 = boundingRect(this);
    QVar7 = boundingRect(region);
    if (((QVar6.x1.m_i.m_i <= QVar7.x2.m_i.m_i && QVar7.x1.m_i.m_i <= QVar6.x2.m_i.m_i) &&
        (QVar7.y1.m_i.m_i <= QVar6.y2.m_i.m_i)) && (QVar6.y1.m_i.m_i <= QVar7.y2.m_i.m_i)) {
      if (iVar2 == 1 && iVar1 == 1) {
        return true;
      }
      r1 = begin(this);
      pQVar4 = end(this);
      for (; r1 != pQVar4; r1 = r1 + 1) {
        r2 = begin(region);
        pQVar5 = end(region);
        while (r2 != pQVar5) {
          bVar3 = rect_intersects(r1,r2);
          r2 = r2 + 1;
          if (bVar3) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool QRegion::isEmpty() const
{
    return d == &shared_empty || d->qt_rgn->numRects == 0;
}